

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::CumulativeReporterBase::
Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
::~Node(Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
        *this)

{
  pointer pcVar1;
  
  (this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__Node_0014dac8;
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ::~vector(&this->children);
  (this->value)._vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_0014bd08;
  pcVar1 = (this->value).groupInfo.name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->value).groupInfo.name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~Node() {}